

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O1

bool __thiscall cmCommandArgument::MayFollow(cmCommandArgument *this,cmCommandArgument *current)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  bVar4 = true;
  if (this->ArgumentsBeforeEmpty == false) {
    p_Var3 = &(this->ArgumentsBefore)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->ArgumentsBefore)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &p_Var3->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(cmCommandArgument **)(p_Var2 + 1) < current]) {
      if (*(cmCommandArgument **)(p_Var2 + 1) >= current) {
        p_Var1 = p_Var2;
      }
    }
    p_Var2 = &p_Var3->_M_header;
    if (((_Rb_tree_header *)p_Var1 != p_Var3) &&
       (p_Var2 = p_Var1, current < *(cmCommandArgument **)(p_Var1 + 1))) {
      p_Var2 = &p_Var3->_M_header;
    }
    bVar4 = (_Rb_tree_header *)p_Var2 != p_Var3;
  }
  return bVar4;
}

Assistant:

bool cmCommandArgument::MayFollow(const cmCommandArgument* current) const
{
  if (this->ArgumentsBeforeEmpty)
    {
    return true;
    }

  std::set<const cmCommandArgument*>::const_iterator argIt
                                         = this->ArgumentsBefore.find(current);
  if (argIt != this->ArgumentsBefore.end())
    {
    return true;
    }

  return false;
}